

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialog::setOption(QFontDialog *this,FontDialogOption option,bool on)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<QFontDialog::FontDialogOption> QVar3;
  QFlagsStorage<QFontDialog::FontDialogOption> QVar4;
  byte in_DL;
  QFlags<QFontDialog::FontDialogOption> *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QFontDialog::FontDialogOption> in_stack_0000000c;
  FontDialogOptions previousOptions;
  FontDialogOption in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3.i = (Int)options((QFontDialog *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  QVar4.i = (Int)QFlags<QFontDialog::FontDialogOption>::operator&(in_RDI,in_stack_ffffffffffffffcc);
  bVar2 = QFlags<QFontDialog::FontDialogOption>::operator!
                    ((QFlags<QFontDialog::FontDialogOption> *)&stack0xfffffffffffffff0);
  if (bVar2 != (bool)((in_DL & 1 ^ 0xff) & 1)) {
    QFlags<QFontDialog::FontDialogOption>::operator^(in_RDI,in_stack_ffffffffffffffcc);
    setOptions((QFontDialog *)CONCAT44(QVar3.i,QVar4.i),(FontDialogOptions)in_stack_0000000c.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialog::setOption(FontDialogOption option, bool on)
{
    const QFontDialog::FontDialogOptions previousOptions = options();
    if (!(previousOptions & option) != !on)
        setOptions(previousOptions ^ option);
}